

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackResourceListBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceListTestCase *pRVar5;
  deInt32 *pdVar6;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *local_50;
  Context *local_48;
  Node *local_40;
  SharedPtrStateBase *local_38;
  
  local_48 = context;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar3 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_40 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_38 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
  local_58 = pNVar3;
  local_50 = (SharedPtrStateBase *)operator_new(0x20);
  local_50->strongRefCount = 0;
  local_50->weakRefCount = 0;
  local_50->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_50[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  local_50->strongRefCount = 1;
  local_50->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_40;
  (pNVar3->m_enclosingNode).m_state = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_38->strongRefCount = local_38->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216be30;
  pNVar3[1]._vptr_Node = (_func_int **)0x19f8266;
  local_88.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_88.m_state = pSVar4;
  pRVar5 = (ResourceListTestCase *)operator_new(0x98);
  ResourceListTestCase::ResourceListTestCase
            (pRVar5,local_48,&local_88,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,
             "builtin_gl_position");
  (pRVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FeedbackResourceListTestCase_0216be68;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pSVar2 = local_88.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_88.m_ptr = (Node *)0x0;
    (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = local_50;
  if (local_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_50->strongRefCount = local_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216be30;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 4;
  local_78.m_ptr = pNVar1;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  pRVar5 = (ResourceListTestCase *)operator_new(0x98);
  ResourceListTestCase::ResourceListTestCase
            (pRVar5,local_48,&local_78,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,
             "default_block_basic_type");
  (pRVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FeedbackResourceListTestCase_0216be68;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pSVar2 = local_78.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_STRUCT_MEMBER;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = local_50;
  if (local_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_50->strongRefCount = local_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216be30;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_68.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_68.m_state = pSVar4;
  pRVar5 = (ResourceListTestCase *)operator_new(0x98);
  ResourceListTestCase::ResourceListTestCase
            (pRVar5,local_48,&local_68,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,
             "default_block_struct_member");
  (pRVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FeedbackResourceListTestCase_0216be68;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pSVar2 = local_68.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_68.m_ptr = (Node *)0x0;
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_78.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = local_50;
  if (local_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_50->strongRefCount = local_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216be30;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_68.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_68.m_state = pSVar4;
  pRVar5 = (ResourceListTestCase *)operator_new(0x98);
  ResourceListTestCase::ResourceListTestCase
            (pRVar5,local_48,&local_68,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,
             "default_block_array");
  (pRVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FeedbackResourceListTestCase_0216be68;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pSVar2 = local_68.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_68.m_ptr = (Node *)0x0;
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_78.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = local_50;
  if (local_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_50->strongRefCount = local_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216be30;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_68.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_68.m_state = pSVar4;
  pRVar5 = (ResourceListTestCase *)operator_new(0x98);
  ResourceListTestCase::ResourceListTestCase
            (pRVar5,local_48,&local_68,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,
             "default_block_array_element");
  (pRVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FeedbackResourceListTestCase_0216be68;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pSVar2 = local_68.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_68.m_ptr = (Node *)0x0;
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_78.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_50;
  if (local_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_50->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_58 = (Node *)0x0;
      (*local_50->_vptr_SharedPtrStateBase[2])(local_50);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_50 != (SharedPtrStateBase *)0x0)) {
      (*local_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_38->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_40 = (Node *)0x0;
      (*local_38->_vptr_SharedPtrStateBase[2])(local_38);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_38 != (SharedPtrStateBase *)0x0)) {
      (*local_38->_vptr_SharedPtrStateBase[1])();
      return;
    }
  }
  return;
}

Assistant:

static void generateTransformFeedbackResourceListBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, xfbTarget, "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array_element"));
	}
}